

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptString::IsEnumerable(JavascriptString *this,PropertyId propertyId)

{
  BOOL BVar1;
  undefined8 in_RAX;
  uint local_14 [2];
  charcount_t index;
  
  local_14[0] = (uint)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_14);
  if ((BVar1 == 0) || (this->m_charLength <= local_14[0])) {
    BVar1 = 0;
  }
  else {
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

BOOL JavascriptString::IsEnumerable(PropertyId propertyId)
    {
        ScriptContext* scriptContext = GetScriptContext();
        charcount_t index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (index < this->GetLength())
            {
                return true;
            }
        }
        return false;
    }